

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

MatchFunction * __thiscall
duckdb::RowMatcher::GetMatchFunction<true,double>
          (MatchFunction *__return_storage_ptr__,RowMatcher *this,ExpressionType predicate)

{
  uint uVar1;
  InternalException *this_00;
  allocator local_61;
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->child_functions).
  super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>.
  super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->child_functions).
  super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>.
  super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->child_functions).
  super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>.
  super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = predicate - 0x19;
  if (((byte)uVar1 < 0x10) && ((0x903fU >> (uVar1 & 0x1f) & 1) != 0)) {
    __return_storage_ptr__->function =
         (match_function_t)(&PTR_TemplatedMatch<true,double,duckdb::Equals>_027abfd8)[uVar1 & 0xff];
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Unsupported ExpressionType for RowMatcher::GetMatchFunction: %s",
             &local_61);
  EnumUtil::ToString<duckdb::ExpressionType>(&local_60,predicate);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_40,&local_60);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

MatchFunction RowMatcher::GetMatchFunction(const ExpressionType predicate) {
	MatchFunction result;
	switch (predicate) {
	case ExpressionType::COMPARE_EQUAL:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, Equals>;
		break;
	case ExpressionType::COMPARE_NOTEQUAL:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, NotEquals>;
		break;
	case ExpressionType::COMPARE_DISTINCT_FROM:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, DistinctFrom>;
		break;
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, NotDistinctFrom>;
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, GreaterThan>;
		break;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, GreaterThanEquals>;
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, LessThan>;
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, LessThanEquals>;
		break;
	default:
		throw InternalException("Unsupported ExpressionType for RowMatcher::GetMatchFunction: %s",
		                        EnumUtil::ToString(predicate));
	}
	return result;
}